

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void print_all_live_ranges(gen_ctx_t gen_ctx)

{
  MIR_context_t ctx_00;
  FILE *pFVar1;
  int iVar2;
  MIR_type_t tp;
  size_t sVar3;
  live_range_t_conflict lr_00;
  char *pcVar4;
  char *pcVar5;
  MIR_reg_t var;
  ulong local_28;
  size_t i;
  live_range_t_conflict lr;
  MIR_context_t ctx;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  fprintf((FILE *)gen_ctx->debug_file,"+++++++++++++Live ranges:\n");
  for (local_28 = 0; sVar3 = VARR_live_range_tlength(gen_ctx->lr_ctx->var_live_ranges),
      local_28 < sVar3; local_28 = local_28 + 1) {
    lr_00 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,local_28);
    if (lr_00 != (live_range_t_conflict)0x0) {
      fprintf((FILE *)gen_ctx->debug_file,"%lu",local_28);
      var = (MIR_reg_t)local_28;
      if (gen_ctx->lr_ctx->scan_vars_num != 0) {
        pFVar1 = (FILE *)gen_ctx->debug_file;
        iVar2 = var_to_scan_var(gen_ctx,var);
        fprintf(pFVar1," (%lu)",(long)iVar2);
      }
      if (0x21 < local_28) {
        pFVar1 = (FILE *)gen_ctx->debug_file;
        tp = MIR_reg_type(ctx_00,var - 0x21,(gen_ctx->curr_func_item->u).func);
        pcVar4 = MIR_type_str(ctx_00,tp);
        pcVar5 = MIR_reg_name(ctx_00,var - 0x21,(gen_ctx->curr_func_item->u).func);
        fprintf(pFVar1," (%s:%s)",pcVar4,pcVar5);
      }
      fprintf((FILE *)gen_ctx->debug_file,":");
      print_live_ranges(gen_ctx,lr_00);
    }
  }
  return;
}

Assistant:

static void print_all_live_ranges (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  live_range_t lr;

  fprintf (debug_file, "+++++++++++++Live ranges:\n");
  for (size_t i = 0; i < VARR_LENGTH (live_range_t, var_live_ranges); i++) {
    if ((lr = VARR_GET (live_range_t, var_live_ranges, i)) == NULL) continue;
    fprintf (debug_file, "%lu", (unsigned long) i);
    if (scan_vars_num != 0)
      fprintf (debug_file, " (%lu)", (unsigned long) var_to_scan_var (gen_ctx, (MIR_reg_t) i));
    if (i > MAX_HARD_REG)
      fprintf (debug_file, " (%s:%s)",
               MIR_type_str (ctx, MIR_reg_type (ctx, (MIR_reg_t) (i - MAX_HARD_REG),
                                                curr_func_item->u.func)),
               MIR_reg_name (ctx, (MIR_reg_t) (i - MAX_HARD_REG), curr_func_item->u.func));
    fprintf (debug_file, ":");
    print_live_ranges (gen_ctx, lr);
  }
}